

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdicc.c
# Opt level: O0

boolean marker_is_icc(jpeg_saved_marker_ptr_conflict marker)

{
  bool local_9;
  jpeg_saved_marker_ptr_conflict marker_local;
  
  local_9 = false;
  if (((((marker->marker == 0xe2) && (local_9 = false, 0xd < marker->data_length)) &&
       (local_9 = false, *marker->data == 'I')) &&
      (((local_9 = false, marker->data[1] == 'C' && (local_9 = false, marker->data[2] == 'C')) &&
       ((local_9 = false, marker->data[3] == '_' &&
        ((local_9 = false, marker->data[4] == 'P' && (local_9 = false, marker->data[5] == 'R')))))))
      ) && ((local_9 = false, marker->data[6] == 'O' &&
            ((((local_9 = false, marker->data[7] == 'F' && (local_9 = false, marker->data[8] == 'I')
               ) && (local_9 = false, marker->data[9] == 'L')) &&
             (local_9 = false, marker->data[10] == 'E')))))) {
    local_9 = marker->data[0xb] == '\0';
  }
  return (boolean)local_9;
}

Assistant:

LOCAL(boolean)
marker_is_icc(jpeg_saved_marker_ptr marker)
{
  return
    marker->marker == ICC_MARKER &&
    marker->data_length >= ICC_OVERHEAD_LEN &&
    /* verify the identifying string */
    marker->data[0] == 0x49 &&
    marker->data[1] == 0x43 &&
    marker->data[2] == 0x43 &&
    marker->data[3] == 0x5F &&
    marker->data[4] == 0x50 &&
    marker->data[5] == 0x52 &&
    marker->data[6] == 0x4F &&
    marker->data[7] == 0x46 &&
    marker->data[8] == 0x49 &&
    marker->data[9] == 0x4C &&
    marker->data[10] == 0x45 &&
    marker->data[11] == 0x0;
}